

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O2

void stbds_hmfree_func(void *a,size_t elemsize)

{
  void *__ptr;
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  if (a != (void *)0x0) {
    lVar1 = *(long *)((long)a + -0x10);
    if (lVar1 == 0) {
      __ptr = (void *)0x0;
    }
    else {
      if (*(char *)(lVar1 + 0x59) == '\x02') {
        puVar2 = (undefined8 *)((long)a + elemsize);
        for (uVar3 = 1; uVar3 < *(ulong *)((long)a + -0x20); uVar3 = uVar3 + 1) {
          free((void *)*puVar2);
          puVar2 = (undefined8 *)((long)puVar2 + elemsize);
        }
        lVar1 = *(long *)((long)a + -0x10);
      }
      stbds_strreset((stbds_string_arena *)(lVar1 + 0x48));
      __ptr = *(void **)((long)a + -0x10);
    }
    free(__ptr);
    free((ulong *)((long)a + -0x20));
    return;
  }
  return;
}

Assistant:

void stbds_hmfree_func(void *a, size_t elemsize)
{
  if (a == NULL) return;
  if (stbds_hash_table(a) != NULL) {
    if (stbds_hash_table(a)->string.mode == STBDS_SH_STRDUP) {
      size_t i;
      // skip 0th element, which is default
      for (i=1; i < stbds_header(a)->length; ++i)
        STBDS_FREE(NULL, *(char**) ((char *) a + elemsize*i));
    }
    stbds_strreset(&stbds_hash_table(a)->string);
  }
  STBDS_FREE(NULL, stbds_header(a)->hash_table);
  STBDS_FREE(NULL, stbds_header(a));
}